

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O0

bool __thiscall QMimeData::hasText(QMimeData *this)

{
  bool bVar1;
  byte bVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  bool local_69;
  QMimeData *in_stack_ffffffffffffffb0;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  textPlainLiteral();
  bVar1 = false;
  bVar2 = (**(code **)(*in_RDI + 0x60))(in_RDI,local_20);
  local_69 = true;
  if ((bVar2 & 1) == 0) {
    textPlainUtf8Literal();
    bVar1 = true;
    bVar2 = (**(code **)(*in_RDI + 0x60))(in_RDI,local_38);
    local_69 = true;
    if ((bVar2 & 1) == 0) {
      local_69 = hasUrls(in_stack_ffffffffffffffb0);
    }
  }
  if (bVar1) {
    QString::~QString((QString *)0x3e6255);
  }
  QString::~QString((QString *)0x3e625f);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_69;
}

Assistant:

bool QMimeData::hasText() const
{
    return hasFormat(textPlainLiteral()) || hasFormat(textPlainUtf8Literal()) || hasUrls();
}